

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O0

void __thiscall
BayesianGameCollaborativeGraphical::SetUtility
          (BayesianGameCollaborativeGraphical *this,Index e,Index jtI_e,Index jaI_e,double ut)

{
  BayesianGameIdenticalPayoff *in_XMM0_Qa;
  Index in_stack_ffffffffffffffd8;
  Index in_stack_ffffffffffffffdc;
  
  std::vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>::at
            ((vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
              *)in_XMM0_Qa,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  BayesianGameIdenticalPayoff::SetUtility
            (in_XMM0_Qa,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,4.50295777397396e-317);
  return;
}

Assistant:

void 
BayesianGameCollaborativeGraphical::
SetUtility(Index e, 
        const std::vector< Index >& indTypes_e, 
        const std::vector< Index >& actions_e,
        double ut)
{ _m_LRFs.at(e)->SetUtility(indTypes_e, actions_e, ut); }